

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmqBrokerServer.cpp
# Opt level: O1

void __thiscall helics::apps::zmqBrokerServer::mainLoop(zmqBrokerServer *this)

{
  _Manager_type *pp_Var1;
  pointer pfVar2;
  pointer pfVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  ulong uVar8;
  function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>
  *pfVar9;
  pointer pfVar10;
  error_t *this_00;
  unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_> *skt;
  unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_> *puVar11;
  ulong uVar12;
  _Head_base<0UL,_zmq::socket_t_*,_false> *p_Var13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_> *socket;
  long lVar17;
  vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_> poller;
  vector<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
  handleMessage;
  vector<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>
  sockets;
  shared_ptr<ZmqContextManager> ctx;
  vector<helics::apps::zmqBrokerServer::zmqServerData,_std::allocator<helics::apps::zmqBrokerServer::zmqServerData>_>
  data;
  message_t msg;
  undefined1 local_108 [32];
  vector<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
  local_e8;
  undefined1 local_c8 [32];
  undefined1 local_a8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_90;
  string local_78 [2];
  _Head_base<0UL,_zmq::socket_t_*,_false> local_38;
  
  local_c8._0_8_ = (unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_> *)0x0;
  local_c8._8_8_ = (unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_> *)0x0;
  local_c8._16_8_ = 0;
  aStack_90._8_8_ = 0;
  local_a8._16_8_ = 0;
  aStack_90._M_allocated_capacity = 0;
  local_e8.
  super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>
        *)0x0;
  local_e8.
  super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>
        *)0x0;
  local_e8.
  super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>
        *)0x0;
  local_78[0]._M_string_length = 0;
  local_78[0].field_2._M_local_buf[0] = '\0';
  local_78[0]._M_dataplus._M_p = (pointer)&local_78[0].field_2;
  ZmqContextManager::getContextPointer((ZmqContextManager *)local_a8,local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78[0]._M_dataplus._M_p != &local_78[0].field_2) {
    operator_delete(local_78[0]._M_dataplus._M_p,
                    CONCAT71(local_78[0].field_2._M_allocated_capacity._1_7_,
                             local_78[0].field_2._M_local_buf[0]) + 1);
  }
  if (this->zmq_enabled_ == true) {
    loadZMQsocket((zmqBrokerServer *)local_108,(context_t *)this);
    std::
    vector<std::unique_ptr<zmq::socket_t,std::default_delete<zmq::socket_t>>,std::allocator<std::unique_ptr<zmq::socket_t,std::default_delete<zmq::socket_t>>>>
    ::emplace_back<std::unique_ptr<zmq::socket_t,std::default_delete<zmq::socket_t>>>
              ((vector<std::unique_ptr<zmq::socket_t,std::default_delete<zmq::socket_t>>,std::allocator<std::unique_ptr<zmq::socket_t,std::default_delete<zmq::socket_t>>>>
                *)local_c8,
               (unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_> *)local_108);
    generateServerData((zmqServerData *)local_78,local_108._8_4_ + 3,2);
    CLI::std::
    vector<helics::apps::zmqBrokerServer::zmqServerData,_std::allocator<helics::apps::zmqBrokerServer::zmqServerData>_>
    ::emplace_back<helics::apps::zmqBrokerServer::zmqServerData>
              ((vector<helics::apps::zmqBrokerServer::zmqServerData,_std::allocator<helics::apps::zmqBrokerServer::zmqServerData>_>
                *)(local_a8 + 0x10),(zmqServerData *)local_78);
    CLI::std::
    vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>
    ::~vector((vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>
               *)local_78);
    pfVar3 = local_e8.
             super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pfVar2 = local_e8.
             super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_e8.
        super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_e8.
        super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      if ((long)local_e8.
                super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_e8.
                super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x7fffffffffffffe0) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar12 = (long)local_e8.
                     super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_e8.
                     super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      uVar8 = uVar12 + (uVar12 == 0);
      uVar15 = uVar8 + uVar12;
      if (0x3fffffffffffffe < uVar15) {
        uVar15 = 0x3ffffffffffffff;
      }
      if (CARRY8(uVar8,uVar12)) {
        uVar15 = 0x3ffffffffffffff;
      }
      if (uVar15 == 0) {
        pfVar9 = (function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>
                  *)0x0;
      }
      else {
        pfVar9 = __gnu_cxx::
                 new_allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>
                 ::allocate((new_allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>
                             *)&local_e8,uVar15,(void *)0x0);
      }
      *(undefined8 *)&pfVar9[uVar12].super__Function_base._M_functor = 0;
      *(undefined8 *)((long)&pfVar9[uVar12].super__Function_base._M_functor + 8) = 0;
      pp_Var1 = &pfVar9[uVar12].super__Function_base._M_manager;
      *pp_Var1 = (_Manager_type)0x0;
      pp_Var1[1] = (_Manager_type)0x0;
      *(zmqBrokerServer **)&pfVar9[uVar12].super__Function_base._M_functor = this;
      pfVar9[uVar12]._M_invoker =
           CLI::std::
           _Function_handler<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/zmqBrokerServer.cpp:205:36)>
           ::_M_invoke;
      pfVar9[uVar12].super__Function_base._M_manager =
           CLI::std::
           _Function_handler<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/zmqBrokerServer.cpp:205:36)>
           ::_M_manager;
      pfVar10 = CLI::std::
                vector<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
                ::_S_do_relocate(pfVar2,pfVar3,pfVar9,&local_e8);
      pfVar10 = CLI::std::
                vector<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
                ::_S_do_relocate(pfVar3,pfVar3,pfVar10 + 1,&local_e8);
      if (pfVar2 != (function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>
                     *)0x0) {
        operator_delete(pfVar2,(long)local_e8.
                                     super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pfVar2);
      }
      local_e8.
      super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pfVar9 + uVar15;
      local_e8.
      super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pfVar9;
      local_e8.
      super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pfVar10;
    }
    else {
      *(undefined8 *)
       &((local_e8.
          super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->super__Function_base)._M_functor = 0;
      *(__pthread_internal_list **)
       ((long)local_e8.
              super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
              ._M_impl.super__Vector_impl_data._M_finish + 8) = (__pthread_internal_list *)0x0;
      ((__pthread_internal_list *)
      ((long)local_e8.
             super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 0x10))->__prev =
           (__pthread_internal_list *)0x0;
      ((__pthread_internal_list *)
      ((long)local_e8.
             super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 0x10))->__next =
           (__pthread_internal_list *)0x0;
      *(zmqBrokerServer **)
       &((local_e8.
          super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->super__Function_base)._M_functor = this;
      ((__pthread_internal_list *)
      ((long)local_e8.
             super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 0x10))->__next =
           (__pthread_internal_list *)
           CLI::std::
           _Function_handler<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/zmqBrokerServer.cpp:205:36)>
           ::_M_invoke;
      ((__pthread_internal_list *)
      ((long)local_e8.
             super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 0x10))->__prev =
           (__pthread_internal_list *)
           CLI::std::
           _Function_handler<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/zmqBrokerServer.cpp:205:36)>
           ::_M_manager;
      local_e8.
      super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>
            *)((long)local_e8.
                     super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 0x20);
    }
    CLI::std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>::~unique_ptr
              ((unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_> *)local_108);
  }
  if (this->zmqss_enabled_ == true) {
    loadZMQSSsocket((zmqBrokerServer *)local_108,(context_t *)this);
    std::
    vector<std::unique_ptr<zmq::socket_t,std::default_delete<zmq::socket_t>>,std::allocator<std::unique_ptr<zmq::socket_t,std::default_delete<zmq::socket_t>>>>
    ::emplace_back<std::unique_ptr<zmq::socket_t,std::default_delete<zmq::socket_t>>>
              ((vector<std::unique_ptr<zmq::socket_t,std::default_delete<zmq::socket_t>>,std::allocator<std::unique_ptr<zmq::socket_t,std::default_delete<zmq::socket_t>>>>
                *)local_c8,
               (unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_> *)local_108);
    generateServerData((zmqServerData *)local_78,local_108._8_4_ + 4,1);
    CLI::std::
    vector<helics::apps::zmqBrokerServer::zmqServerData,_std::allocator<helics::apps::zmqBrokerServer::zmqServerData>_>
    ::emplace_back<helics::apps::zmqBrokerServer::zmqServerData>
              ((vector<helics::apps::zmqBrokerServer::zmqServerData,_std::allocator<helics::apps::zmqBrokerServer::zmqServerData>_>
                *)(local_a8 + 0x10),(zmqServerData *)local_78);
    CLI::std::
    vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>
    ::~vector((vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>
               *)local_78);
    pfVar3 = local_e8.
             super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pfVar2 = local_e8.
             super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_e8.
        super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_e8.
        super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      if ((long)local_e8.
                super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_e8.
                super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x7fffffffffffffe0) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar12 = (long)local_e8.
                     super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_e8.
                     super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      uVar8 = uVar12 + (uVar12 == 0);
      uVar15 = uVar8 + uVar12;
      if (0x3fffffffffffffe < uVar15) {
        uVar15 = 0x3ffffffffffffff;
      }
      if (CARRY8(uVar8,uVar12)) {
        uVar15 = 0x3ffffffffffffff;
      }
      if (uVar15 == 0) {
        pfVar9 = (function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>
                  *)0x0;
      }
      else {
        pfVar9 = __gnu_cxx::
                 new_allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>
                 ::allocate((new_allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>
                             *)&local_e8,uVar15,(void *)0x0);
      }
      *(undefined8 *)&pfVar9[uVar12].super__Function_base._M_functor = 0;
      *(undefined8 *)((long)&pfVar9[uVar12].super__Function_base._M_functor + 8) = 0;
      pp_Var1 = &pfVar9[uVar12].super__Function_base._M_manager;
      *pp_Var1 = (_Manager_type)0x0;
      pp_Var1[1] = (_Manager_type)0x0;
      *(zmqBrokerServer **)&pfVar9[uVar12].super__Function_base._M_functor = this;
      pfVar9[uVar12]._M_invoker =
           CLI::std::
           _Function_handler<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/zmqBrokerServer.cpp:217:36)>
           ::_M_invoke;
      pfVar9[uVar12].super__Function_base._M_manager =
           CLI::std::
           _Function_handler<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/zmqBrokerServer.cpp:217:36)>
           ::_M_manager;
      pfVar10 = CLI::std::
                vector<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
                ::_S_do_relocate(pfVar2,pfVar3,pfVar9,&local_e8);
      pfVar10 = CLI::std::
                vector<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
                ::_S_do_relocate(pfVar3,pfVar3,pfVar10 + 1,&local_e8);
      if (pfVar2 != (function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>
                     *)0x0) {
        operator_delete(pfVar2,(long)local_e8.
                                     super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pfVar2);
      }
      local_e8.
      super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pfVar9 + uVar15;
      local_e8.
      super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pfVar9;
      local_e8.
      super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pfVar10;
    }
    else {
      *(undefined8 *)
       &((local_e8.
          super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->super__Function_base)._M_functor = 0;
      *(__pthread_internal_list **)
       ((long)local_e8.
              super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
              ._M_impl.super__Vector_impl_data._M_finish + 8) = (__pthread_internal_list *)0x0;
      ((__pthread_internal_list *)
      ((long)local_e8.
             super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 0x10))->__prev =
           (__pthread_internal_list *)0x0;
      ((__pthread_internal_list *)
      ((long)local_e8.
             super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 0x10))->__next =
           (__pthread_internal_list *)0x0;
      *(zmqBrokerServer **)
       &((local_e8.
          super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->super__Function_base)._M_functor = this;
      ((__pthread_internal_list *)
      ((long)local_e8.
             super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 0x10))->__next =
           (__pthread_internal_list *)
           CLI::std::
           _Function_handler<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/zmqBrokerServer.cpp:217:36)>
           ::_M_invoke;
      ((__pthread_internal_list *)
      ((long)local_e8.
             super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 0x10))->__prev =
           (__pthread_internal_list *)
           CLI::std::
           _Function_handler<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/zmqBrokerServer.cpp:217:36)>
           ::_M_manager;
      local_e8.
      super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>
            *)((long)local_e8.
                     super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 0x20);
    }
    CLI::std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>::~unique_ptr
              ((unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_> *)local_108);
  }
  uVar5 = local_c8._8_8_;
  local_108._0_8_ = (__uniq_ptr_impl<zmq::socket_t,_std::default_delete<zmq::socket_t>_>)0x0;
  local_108._8_8_ = 0;
  local_108._16_8_ = (zmq_pollitem_t *)0x0;
  for (puVar11 = (unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_> *)local_c8._0_8_;
      puVar11 != (unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_> *)uVar5;
      puVar11 = puVar11 + 1) {
    if (local_108._8_8_ == local_108._16_8_) {
      CLI::std::vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>::_M_realloc_insert<>
                ((vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_> *)local_108,
                 (iterator)local_108._8_8_);
    }
    else {
      ((zmq_pollitem_t *)local_108._8_8_)->socket = (void *)0x0;
      ((zmq_pollitem_t *)local_108._8_8_)->fd = 0;
      ((zmq_pollitem_t *)local_108._8_8_)->events = 0;
      ((zmq_pollitem_t *)local_108._8_8_)->revents = 0;
      local_108._8_8_ = local_108._8_8_ + 0x10;
    }
    ((zmq_pollitem_t *)(local_108._8_8_ - 0x10))->socket =
         (((puVar11->_M_t).super___uniq_ptr_impl<zmq::socket_t,_std::default_delete<zmq::socket_t>_>
           ._M_t.super__Tuple_impl<0UL,_zmq::socket_t_*,_std::default_delete<zmq::socket_t>_>.
           super__Head_base<0UL,_zmq::socket_t_*,_false>._M_head_impl)->super_socket_base)._handle;
    *(short *)(local_108._8_8_ - 4) = 1;
  }
  do {
    p_Var13 = (_Head_base<0UL,_zmq::socket_t_*,_false> *)
              ((ulong)(local_108._8_8_ - local_108._0_8_) >> 4);
    iVar7 = zmq_poll(local_108._0_8_,p_Var13,5000);
    if (iVar7 < 0) {
      this_00 = (error_t *)__cxa_allocate_exception(0x10);
      zmq::error_t::error_t(this_00);
      __cxa_throw(this_00,&zmq::error_t::typeinfo,std::exception::~exception);
    }
    if (iVar7 != 0) {
      zmq_msg_init(local_78);
      if (local_108._8_8_ != local_108._0_8_) {
        lVar16 = 0xe;
        lVar17 = 0;
        lVar14 = 0;
        uVar15 = 0;
        do {
          if ((*(byte *)(local_108._0_8_ + lVar16) & 1) != 0) {
            local_38._M_head_impl = *(socket_t **)(local_c8._0_8_ + uVar15 * 8);
            if (*(long *)((long)((long)local_e8.
                                       super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 0x10) + lVar14)
                == 0) {
              std::__throw_bad_function_call();
            }
            p_Var13 = &local_38;
            (**(code **)((long)((long)local_e8.
                                      super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 0x18) + lVar14))
                      ((long)local_e8.
                             super__Vector_base<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar14,p_Var13,
                       local_a8._16_8_ + lVar17);
          }
          uVar15 = uVar15 + 1;
          lVar14 = lVar14 + 0x20;
          lVar17 = lVar17 + 0x18;
          lVar16 = lVar16 + 0x10;
        } while (uVar15 < (ulong)((long)(local_108._8_8_ - local_108._0_8_) >> 4));
      }
      zmq_msg_close(local_78);
    }
    uVar5 = local_c8._8_8_;
    puVar11 = (unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_> *)local_c8._0_8_;
  } while (((this->exitAll)._M_base._M_i & 1U) == 0);
  for (; uVar6 = local_c8._8_8_, uVar4 = local_c8._0_8_,
      puVar11 != (unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_> *)uVar5;
      puVar11 = puVar11 + 1) {
    zmq::socket_t::close
              ((puVar11->_M_t).
               super___uniq_ptr_impl<zmq::socket_t,_std::default_delete<zmq::socket_t>_>._M_t.
               super__Tuple_impl<0UL,_zmq::socket_t_*,_std::default_delete<zmq::socket_t>_>.
               super__Head_base<0UL,_zmq::socket_t_*,_false>._M_head_impl,(int)p_Var13);
  }
  puVar11 = (unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_> *)local_c8._0_8_;
  if (local_c8._8_8_ != local_c8._0_8_) {
    do {
      CLI::std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>::~unique_ptr(puVar11)
      ;
      puVar11 = puVar11 + 1;
    } while (puVar11 != (unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_> *)uVar6);
    local_c8._8_8_ = uVar4;
  }
  if ((__uniq_ptr_impl<zmq::socket_t,_std::default_delete<zmq::socket_t>_>)local_108._0_8_ !=
      (__uniq_ptr_impl<zmq::socket_t,_std::default_delete<zmq::socket_t>_>)0x0) {
    operator_delete((void *)local_108._0_8_,local_108._16_8_ - local_108._0_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
  }
  CLI::std::
  vector<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>,_std::allocator<std::function<void_(zmq::socket_t_*,_std::vector<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>_&)>_>_>
  ::~vector(&local_e8);
  CLI::std::
  vector<helics::apps::zmqBrokerServer::zmqServerData,_std::allocator<helics::apps::zmqBrokerServer::zmqServerData>_>
  ::~vector((vector<helics::apps::zmqBrokerServer::zmqServerData,_std::allocator<helics::apps::zmqBrokerServer::zmqServerData>_>
             *)(local_a8 + 0x10));
  CLI::std::
  vector<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>
  ::~vector((vector<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>,_std::allocator<std::unique_ptr<zmq::socket_t,_std::default_delete<zmq::socket_t>_>_>_>
             *)local_c8);
  return;
}

Assistant:

void zmqBrokerServer::mainLoop()
{
#ifdef HELICS_ENABLE_ZMQ_CORE
    std::vector<std::unique_ptr<zmq::socket_t>> sockets;
    std::vector<zmqServerData> data;
    std::vector<std::function<void(zmq::socket_t*, portData&)>> handleMessage;

    auto ctx = ZmqContextManager::getContextPointer();

    if (zmq_enabled_) {
        auto sdata = loadZMQsocket(ctx->getBaseContext());
        sockets.push_back(std::move(sdata.first));
        data.push_back(generateServerData(sdata.second + 3, 2));
        handleMessage.emplace_back([this](zmq::socket_t* skt, portData& pdata) {
            zmq::message_t msg;
            skt->recv(msg);
            std::string response = generateResponseToMessage(msg, pdata, CoreType::ZMQ);
            skt->send(response);
        });
    }

    if (zmqss_enabled_) {
        auto sdata = loadZMQSSsocket(ctx->getBaseContext());
        sockets.push_back(std::move(sdata.first));
        data.push_back(generateServerData(sdata.second + 4, 1));
        handleMessage.emplace_back([this](zmq::socket_t* skt, portData& pdata) {
            zmq::message_t msg1;
            zmq::message_t msg2;
            skt->recv(msg1);  // should be null
            skt->recv(msg2);
            std::string response = generateResponseToMessage(msg2, pdata, CoreType::ZMQ_SS);
            skt->send(msg1, zmq::send_flags::sndmore);
            skt->send(std::string{}, zmq::send_flags::sndmore);
            skt->send(response, zmq::send_flags::dontwait);
        });
    }

    std::vector<zmq::pollitem_t> poller;
    for (auto& socket : sockets) {
        poller.emplace_back();
        poller.back().socket = static_cast<void*>(*socket);
        poller.back().events = ZMQ_POLLIN;
    }

    int rc = 0;
    while (rc >= 0) {
        try {
            rc = zmq::poll(poller, std::chrono::milliseconds(5000));
        }
        catch (const zmq::error_t& e) {
            logMessage(e.what());
            return;
        }
        if (rc < 0) {
            std::cerr << "ZMQ broker connection error (2)" << std::endl;
            break;
        }
        if (rc > 0) {
            zmq::message_t msg;
            for (std::size_t ii = 0; ii < poller.size(); ++ii) {
                if (zmq::has_message(poller[ii])) {
                    handleMessage[ii](sockets[ii].get(), data[ii].ports);
                }
            }
        }
        if (exitAll.load()) {
            break;
        }
    }

    for (auto& skt : sockets) {
        skt->close();
    }
    sockets.clear();

#endif
}